

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

void __thiscall
r_code::list<core::P<r_exec::Overlay>_>::push_back_new_cell
          (list<core::P<r_exec::Overlay>_> *this,P<r_exec::Overlay> *t)

{
  _Object *p_Var1;
  cell c;
  value_type local_28;
  
  local_28.data.object = (_Object *)0x0;
  p_Var1 = t->object;
  if (p_Var1 != (_Object *)0x0) {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + 1;
    UNLOCK();
    local_28.data.object = p_Var1;
  }
  local_28.next = -1;
  local_28.prev = this->used_cells_tail;
  std::
  vector<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
  ::push_back(&this->cells,&local_28);
  this->used_cells_tail =
       ((long)(this->cells).
              super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->cells).
              super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + -1;
  if (local_28.data.object != (_Object *)0x0) {
    LOCK();
    ((local_28.data.object)->refCount).super___atomic_base<long>._M_i =
         ((local_28.data.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_28.data.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*(local_28.data.object)->_vptr__Object[1])();
    }
  }
  return;
}

Assistant:

void push_back_new_cell(const T &t)
    {
        cell c;
        c.data = t;
        c.next = null;
        c.prev = used_cells_tail;
        cells.push_back(c);
        used_cells_tail = cells.size() - 1;
    }